

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

void __thiscall wasm::PassRunner::addIfNoDWARFIssues(PassRunner *this,string *passName)

{
  bool bVar1;
  uint uVar2;
  string *name;
  pointer pPVar3;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> local_58 [3];
  string local_40 [32];
  undefined1 local_20 [8];
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> pass;
  string *passName_local;
  PassRunner *this_local;
  
  pass._M_t.super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
  super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
       (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)passName;
  name = (string *)PassRegistry::get();
  std::__cxx11::string::string(local_40,(string *)passName);
  PassRegistry::createPass((PassRegistry *)local_20,name);
  std::__cxx11::string::~string(local_40);
  pPVar3 = std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::operator->
                     ((unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)local_20);
  uVar2 = (*pPVar3->_vptr_Pass[7])();
  if (((uVar2 & 1) == 0) || (bVar1 = shouldPreserveDWARF(this), !bVar1)) {
    std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::unique_ptr
              (local_58,(unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)local_20);
    (*this->_vptr_PassRunner[2])(this,local_58);
    std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::~unique_ptr(local_58);
  }
  std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::~unique_ptr
            ((unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)local_20);
  return;
}

Assistant:

void PassRunner::addIfNoDWARFIssues(std::string passName) {
  auto pass = PassRegistry::get()->createPass(passName);
  if (!pass->invalidatesDWARF() || !shouldPreserveDWARF()) {
    doAdd(std::move(pass));
  }
}